

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.hpp
# Opt level: O0

Scoped * __thiscall diy::stats::Profiler::scoped(Profiler *this,string *name)

{
  string *in_RDX;
  Scoped *in_RDI;
  string local_38 [8];
  string *in_stack_ffffffffffffffd0;
  Profiler *in_stack_ffffffffffffffd8;
  ScopedProfile<diy::stats::Profiler> *in_stack_ffffffffffffffe0;
  
  std::__cxx11::string::string(local_38,in_RDX);
  ScopedProfile<diy::stats::Profiler>::ScopedProfile
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

Scoped  scoped(std::string name)            { return Scoped(*this, name); }